

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientMonitor.cpp
# Opt level: O0

int __thiscall ClientMonitor::findClientBy(ClientMonitor *this,string *username)

{
  __type _Var1;
  ulong uVar2;
  size_type sVar3;
  ClientNotFound *this_00;
  Client local_40;
  int local_1c;
  string *psStack_18;
  int i;
  string *username_local;
  ClientMonitor *this_local;
  
  local_1c = 0;
  psStack_18 = username;
  username_local = (string *)this;
  while( true ) {
    uVar2 = (ulong)local_1c;
    sVar3 = std::vector<Client_*,_std::allocator<Client_*>_>::size(&this->clients);
    if (sVar3 <= uVar2) {
      this_00 = (ClientNotFound *)__cxa_allocate_exception(8);
      memset(this_00,0,8);
      ClientNotFound::ClientNotFound(this_00);
      __cxa_throw(this_00,&ClientNotFound::typeinfo,ClientNotFound::~ClientNotFound);
    }
    std::vector<Client_*,_std::allocator<Client_*>_>::operator[](&this->clients,(long)local_1c);
    Client::getUsername_abi_cxx11_(&local_40);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_40,psStack_18);
    std::__cxx11::string::~string((string *)&local_40);
    if (_Var1) break;
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

int ClientMonitor::findClientBy(const std::string& username) {
    for(int i = 0; i < clients.size(); i++){
        if(clients[i]->getUsername() == username){
            return i; // we want index instead of client pointer to easily remove clients (erase)
        }
    }
    throw ClientNotFound();
}